

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

void SplittingStepCoefficients_Write(SplittingStepCoefficients coefficients,FILE *outfile)

{
  FILE *in_RSI;
  long *in_RDI;
  int k;
  int j;
  int i_1;
  int i;
  int local_20;
  int local_1c;
  uint local_18;
  int local_14;
  
  if ((((in_RSI != (FILE *)0x0) && (in_RDI != (long *)0x0)) && (*in_RDI != 0)) &&
     (((in_RDI[1] != 0 && (*(long *)in_RDI[1] != 0)) && (**(long **)in_RDI[1] != 0)))) {
    fprintf(in_RSI,"  sequential methods = %i\n",(ulong)*(uint *)(in_RDI + 2));
    fprintf(in_RSI,"  stages = %i\n",(ulong)*(uint *)((long)in_RDI + 0x14));
    fprintf(in_RSI,"  partitions = %i\n",(ulong)*(uint *)(in_RDI + 3));
    fprintf(in_RSI,"  order = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1c));
    fprintf(in_RSI,"  alpha = ");
    for (local_14 = 0; local_14 < (int)in_RDI[2]; local_14 = local_14 + 1) {
      fprintf(in_RSI,"% .15e  ",*(undefined8 *)(*in_RDI + (long)local_14 * 8));
    }
    fprintf(in_RSI,"\n");
    for (local_18 = 0; (int)local_18 < (int)in_RDI[2]; local_18 = local_18 + 1) {
      fprintf(in_RSI,"  beta[%i] = \n",(ulong)local_18);
      for (local_1c = 0; local_1c <= *(int *)((long)in_RDI + 0x14); local_1c = local_1c + 1) {
        fprintf(in_RSI,"      ");
        for (local_20 = 0; local_20 < (int)in_RDI[3]; local_20 = local_20 + 1) {
          fprintf(in_RSI,"% .15e  ",
                  *(undefined8 *)
                   (*(long *)(*(long *)(in_RDI[1] + (long)(int)local_18 * 8) + (long)local_1c * 8) +
                   (long)local_20 * 8));
        }
        fprintf(in_RSI,"\n");
      }
      fprintf(in_RSI,"\n");
    }
  }
  return;
}

Assistant:

void SplittingStepCoefficients_Write(const SplittingStepCoefficients coefficients,
                                     FILE* const outfile)
{
  // TODO(SBR): update when https://github.com/LLNL/sundials/pull/517 merged
  if (outfile == NULL || coefficients == NULL || coefficients->alpha == NULL ||
      coefficients->beta == NULL || coefficients->beta[0] == NULL ||
      coefficients->beta[0][0] == NULL)
  {
    return;
  }

  fprintf(outfile, "  sequential methods = %i\n",
          coefficients->sequential_methods);
  fprintf(outfile, "  stages = %i\n", coefficients->stages);
  fprintf(outfile, "  partitions = %i\n", coefficients->partitions);
  fprintf(outfile, "  order = %i\n", coefficients->order);
  fprintf(outfile, "  alpha = ");
  for (int i = 0; i < coefficients->sequential_methods; i++)
  {
    fprintf(outfile, SUN_FORMAT_E "  ", coefficients->alpha[i]);
  }
  fprintf(outfile, "\n");

  for (int i = 0; i < coefficients->sequential_methods; i++)
  {
    fprintf(outfile, "  beta[%i] = \n", i);
    for (int j = 0; j <= coefficients->stages; j++)
    {
      fprintf(outfile, "      ");
      for (int k = 0; k < coefficients->partitions; k++)
      {
        fprintf(outfile, SUN_FORMAT_E "  ", coefficients->beta[i][j][k]);
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");
  }
}